

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow-misc.c
# Opt level: O1

_Bool borg_twitchy(void)

{
  uint8_t uVar1;
  short sVar2;
  loc grid;
  _Bool _Var3;
  uint32_t uVar4;
  long lVar5;
  keycode_t k;
  long lVar6;
  int iVar7;
  ulong uVar8;
  
  borg_note("# Twitchy!");
  _Var3 = borg_allow_teleport();
  if (((!_Var3) || (_Var3 = borg_caution_phase(L'\x0f',L'\x02'), !_Var3)) ||
     ((_Var3 = borg_spell_fail(PHASE_DOOR,L'('), !_Var3 &&
      ((((_Var3 = borg_spell_fail(PORTAL,L'('), !_Var3 && (_Var3 = borg_shadow_shift(L'('), !_Var3))
        && (_Var3 = borg_activate_item(act_tele_phase), !_Var3)) &&
       ((_Var3 = borg_activate_item(act_tele_long), !_Var3 &&
        (_Var3 = borg_read_scroll(sv_scroll_phase_door), !_Var3)))))))) {
    iVar7 = 0x14;
    while( true ) {
      do {
        do {
          uVar4 = Rand_div(10);
        } while (uVar4 == 0);
      } while (uVar4 == 5);
      if (iVar7 == 0) break;
      borg.goal.g.x = ddx[(int)uVar4] + borg.c.x;
      borg.goal.g.y = ddy[(int)uVar4] + borg.c.y;
      iVar7 = iVar7 + -1;
      grid.y = borg.goal.g.y;
      grid.x = borg.goal.g.x;
      _Var3 = square_in_bounds_fully(cave,grid);
      if (_Var3) {
        if ((7 < (byte)(borg_grids[borg.goal.g.y][borg.goal.g.x].feat - 0xf)) &&
           ((borg_grids[borg.goal.g.y][borg.goal.g.x].kill == '\0' || (borg.trait[0x71] == 0))))
        goto LAB_0021f118;
      }
    }
    iVar7 = 0;
LAB_0021f118:
    if (iVar7 == 0) {
      lVar6 = -4;
      do {
        if (lVar6 != 0) {
          uVar8 = (long)ddx[lVar6 + 5] + (long)borg.c.x;
          lVar5 = (long)borg.c.y;
          sVar2 = ddy[lVar6 + 5];
          _Var3 = square_in_bounds_fully(cave,(loc)(uVar8 & 0xffffffff | sVar2 + lVar5 << 0x20));
          if (_Var3) {
            uVar1 = borg_grids[sVar2 + lVar5][uVar8].feat;
            if (((7 < (byte)(uVar1 - 0xf)) || ((uVar1 != '\x16' && (borg.trait[0x71] != 0)))) &&
               ((borg_grids[sVar2 + lVar5][uVar8].kill == '\0' || (borg.trait[0x71] == 0)))) {
              uVar4 = (int)lVar6 + 5;
              goto LAB_0021f11c;
            }
          }
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 != 5);
      borg_keypress(0x52);
      borg_keypress(0x31);
      borg_keypress(0x30);
      borg_keypress(0x30);
      k = 0x9c;
    }
    else {
LAB_0021f11c:
      if (borg.trait[0x71] != 0) {
        borg_keypress(0x2b);
      }
      k = uVar4 + 0x30;
    }
    borg_keypress(k);
  }
  return true;
}

Assistant:

bool borg_twitchy(void)
{
    int dir = 5;
    int count;
    bool all_walls = true;
    borg_grid * grid = NULL;
    struct loc l;

    /* This is a bad thing */
    borg_note("# Twitchy!");

    /* try to phase out of it */
    if (borg_allow_teleport()) {
        if (borg_caution_phase(15, 2)
            && (borg_spell_fail(PHASE_DOOR, 40) || borg_spell_fail(PORTAL, 40)
                || borg_shadow_shift(40) || borg_activate_item(act_tele_phase)
                || borg_activate_item(act_tele_long)
                || borg_read_scroll(sv_scroll_phase_door))) {
            /* We did something */
            return true;
        }
    }

    /* Pick a random direction */
    count = 20;
    while (true) {
        dir = randint0(10);
        if (dir == 5 || dir == 0)
            continue;

        if (!count)
            break;

        count--;

        /* Hack -- set goal */
        borg.goal.g.x = borg.c.x + ddx[dir];
        borg.goal.g.y = borg.c.y + ddy[dir];

        if (!square_in_bounds_fully(cave, borg.goal.g))
            continue;

        grid = &borg_grids[borg.goal.g.y][borg.goal.g.x];

        /* don't twitch into walls */
        if (grid->feat >= FEAT_SECRET && grid->feat <= FEAT_PERM)
            continue;

        /* monsters count as walls if afraid */
        if (grid->kill && borg.trait[BI_ISAFRAID])
            continue;

        break;
    }

    /* if we can't find a direction, maybe we are surrounded by walls */
    if (!count) {
        for (dir = 1; dir < 10; dir++) {
            if (dir == 5)
                continue;

            /* get the location of postion + direction */
            l.x = borg.c.x + ddx[dir];
            l.y = borg.c.y + ddy[dir];

            if (!square_in_bounds_fully(cave, l))
                continue;

            grid = &borg_grids[l.y][l.x];

            /* don't twitch into walls */
            if (grid->feat >= FEAT_SECRET && grid->feat <= FEAT_PERM) {
                /* unless afraid (and even then, not perm walls) */
                if (!borg.trait[BI_ISAFRAID] || grid->feat == FEAT_PERM)
                    continue;
            }

            /* monsters count as walls if afraid */
            if (grid->kill && borg.trait[BI_ISAFRAID])
                continue;

            all_walls = false;
            break;
        }
        if (all_walls) {
            /* Rest until done */
            borg_keypress('R');
            borg_keypress('1');
            borg_keypress('0');
            borg_keypress('0');
            borg_keypress(KC_ENTER);
            /* We did something */
            return true;
        }
    }

    /* Normally move */

    /* if afraid, we need to try to dig. We have tried everything else */
    /* digging will at least take an action so maybe give time to not be */
    /* afraid */
    if (borg.trait[BI_ISAFRAID])
        borg_keypress('+');

    /* Send direction */
    borg_keypress(I2D(dir));

    /* We did something */
    return true;
}